

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakOutputStringBuffer::reportMemoryLeak
          (MemoryLeakOutputStringBuffer *this,MemoryLeakDetectorNode *leak)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryLeakDetectorNode *leak_local;
  MemoryLeakOutputStringBuffer *this_local;
  
  if (this->total_leaks_ == 0) {
    addMemoryLeakHeader(this);
  }
  this->total_leaks_ = this->total_leaks_ + 1;
  uVar1 = leak->number_;
  sVar2 = leak->size_;
  pcVar3 = leak->file_;
  uVar4 = leak->line_;
  iVar5 = (*leak->allocator_->_vptr_TestMemoryAllocator[5])();
  SimpleStringBuffer::add
            (&this->outputBuffer_,
             "Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n"
             ,(ulong)uVar1,sVar2,pcVar3,uVar4 & 0xffffffff,CONCAT44(extraout_var,iVar5),
             leak->memory_);
  SimpleStringBuffer::addMemoryDump(&this->outputBuffer_,leak->memory_,leak->size_);
  iVar5 = (*leak->allocator_->_vptr_TestMemoryAllocator[5])();
  iVar5 = SimpleString::StrCmp((char *)CONCAT44(extraout_var_00,iVar5),"malloc");
  if (iVar5 == 0) {
    this->giveWarningOnUsingMalloc_ = true;
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::reportMemoryLeak(MemoryLeakDetectorNode* leak)
{
    if (total_leaks_ == 0) {
        addMemoryLeakHeader();
    }

    total_leaks_++;
    outputBuffer_.add("Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n",
            leak->number_, (unsigned long) leak->size_, leak->file_, (int) leak->line_, leak->allocator_->alloc_name(), (void*) leak->memory_);
    outputBuffer_.addMemoryDump(leak->memory_, leak->size_);

    if (SimpleString::StrCmp(leak->allocator_->alloc_name(), (const char*) "malloc") == 0)
        giveWarningOnUsingMalloc_ = true;
}